

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_a0a5e5::HandleLengthCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  size_t sVar2;
  long lVar3;
  string_view value;
  char buffer [1024];
  long *local_428 [2];
  long local_418 [127];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 == 0x60) {
    snprintf((char *)local_428,0x400,"%d",(ulong)(uint)pbVar1[1]._M_string_length);
    this = status->Makefile;
    sVar2 = strlen((char *)local_428);
    value._M_str = (char *)local_428;
    value._M_len = sVar2;
    cmMakefile::AddDefinition(this,pbVar1 + 2,value);
  }
  else {
    local_428[0] = local_418;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,"sub-command LENGTH requires two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_428[0] != local_418) {
      operator_delete(local_428[0],local_418[0] + 1);
    }
  }
  return lVar3 == 0x60;
}

Assistant:

bool HandleLengthCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("sub-command LENGTH requires two arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];

  size_t length = stringValue.size();
  char buffer[1024];
  snprintf(buffer, sizeof(buffer), "%d", static_cast<int>(length));

  status.GetMakefile().AddDefinition(variableName, buffer);
  return true;
}